

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_absdif_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  iVar4 = 0x18;
  bVar5 = 0;
  uVar2 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    uVar3 = ((int)(r1 << ((byte)iVar4 & 0x1f)) >> 0x18) -
            ((int)(r2 << ((byte)iVar4 & 0x1f)) >> 0x18);
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    uVar7 = uVar7 | (int)(char)uVar1 != uVar1;
    uVar6 = uVar6 | uVar1 * 2 ^ uVar1;
    uVar2 = uVar2 | (uVar1 & 0xff) << (bVar5 & 0x1f);
    iVar4 = iVar4 + -8;
    bVar5 = bVar5 + 8;
  } while (iVar4 != -8);
  env->PSW_USB_V = uVar7 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar7 << 0x1f;
  env->PSW_USB_AV = uVar6 << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar6 << 0x18;
  return uVar2;
}

Assistant:

uint32_t helper_absdif_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r2 = sextract32(r2, i * 8, 8);
        b = sextract32(r1, i * 8, 8);
        b = (b > extr_r2) ? (b - extr_r2) : (extr_r2 - b);
        ovf |= (b > 0x7F) || (b < -0x80);
        avf |= b ^ b * 2u;
        ret |= (b & 0xff) << (i * 8);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return ret;
}